

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

void __thiscall
cppcms::crypto::hmac::hmac
          (hmac *this,
          unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
          *digest,key *k)

{
  message_digest *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  invalid_argument *this_00;
  undefined8 uVar3;
  allocator local_55;
  undefined4 local_54;
  string local_50;
  
  (this->d).ptr_ = (data_ *)0x0;
  (this->md_)._M_t.
  super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
  .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
       (message_digest *)0x0;
  (this->md_opad_)._M_t.
  super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
  .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
       (message_digest *)0x0;
  crypto::key::key(&this->key_,k);
  if ((digest->_M_t).
      super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
      ._M_t.
      super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
      .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl !=
      (message_digest *)0x0) {
    std::
    __uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
    ::operator=((__uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                 *)&this->md_,
                (__uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                 *)digest);
    iVar2 = (*((this->md_)._M_t.
               super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
               ._M_t.
               super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
               .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl)->
              _vptr_message_digest[6])();
    pmVar1 = (this->md_opad_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
    (this->md_opad_)._M_t.
    super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
    ._M_t.
    super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
    .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
         (message_digest *)CONCAT44(extraout_var,iVar2);
    if (pmVar1 != (message_digest *)0x0) {
      (*pmVar1->_vptr_message_digest[1])();
    }
    init(this,(EVP_PKEY_CTX *)digest);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x30);
  uVar3 = std::__cxx11::string::string
                    ((string *)&local_50,"Has algorithm is not provided",&local_55);
  local_54 = (undefined4)CONCAT71((int7)((ulong)uVar3 >> 8),1);
  booster::invalid_argument::invalid_argument(this_00,&local_50);
  local_54 = 0;
  __cxa_throw(this_00,&booster::invalid_argument::typeinfo,
              booster::invalid_argument::~invalid_argument);
}

Assistant:

hmac::hmac(std::unique_ptr<message_digest> digest,key const &k) : key_(k)
	{
		if(!digest.get())
			throw booster::invalid_argument("Has algorithm is not provided");
		md_ = std::move(digest);
		md_opad_.reset(md_->clone());
		init();
	}